

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_sorted_suite.cpp
# Opt level: O0

void test_array_boolean_integer(void)

{
  bool bVar1;
  size_type in_RCX;
  char *pcVar2;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init_00;
  basic_variable<std::allocator<char>_> *local_1f8;
  basic_variable<std::allocator<char>_> *local_1d8;
  iterator local_1d0;
  iterator local_1b8;
  basic_variable<std::allocator<char>_> *local_1a0;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  undefined1 local_138 [24];
  variable unsorted;
  iterator local_f0;
  iterator local_d8;
  basic_variable<std::allocator<char>_> *local_b0;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable sorted;
  
  local_b0 = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_b0,true);
  local_b0 = &local_78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_b0,2);
  local_48._0_8_ = &local_a8;
  local_48._8_8_ = 2;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_1d8 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_1d8 = local_1d8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1d8);
  } while (local_1d8 != &local_a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_d8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_f0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  bVar1 = std::is_sorted<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                    (&local_d8,&local_f0);
  pcVar2 = "void test_array_boolean_integer()";
  boost::detail::test_impl
            ("std::is_sorted(sorted.begin(), sorted.end())",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/is_sorted_suite.cpp"
             ,0x26,"void test_array_boolean_integer()",bVar1);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_d8);
  local_1a0 = &local_198;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1a0,2);
  local_1a0 = &local_168;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_1a0,true);
  local_138._0_8_ = &local_198;
  local_138._8_8_ = 2;
  init_00._M_len = (size_type)pcVar2;
  init_00._M_array = (iterator)0x2;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_138 + 0x10),
             (basic_array<std::allocator<char>_> *)local_138._0_8_,init_00);
  local_1f8 = (basic_variable<std::allocator<char>_> *)local_138;
  do {
    local_1f8 = local_1f8 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_1f8);
  } while (local_1f8 != &local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1b8,(basic_variable<std::allocator<char>_> *)(local_138 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1d0,(basic_variable<std::allocator<char>_> *)(local_138 + 0x10));
  bVar1 = std::is_sorted<trial::dynamic::basic_variable<std::allocator<char>>::iterator>
                    (&local_1b8,&local_1d0);
  boost::detail::test_impl
            ("!std::is_sorted(unsorted.begin(), unsorted.end())",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/is_sorted_suite.cpp"
             ,0x28,"void test_array_boolean_integer()",(bool)(~bVar1 & 1));
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_138 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void test_array_boolean_integer()
{
    variable sorted = array::make({ true, 2 });
    TRIAL_PROTOCOL_TEST(std::is_sorted(sorted.begin(), sorted.end()));
    variable unsorted = array::make({ 2, true });
    TRIAL_PROTOCOL_TEST(!std::is_sorted(unsorted.begin(), unsorted.end()));
}